

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O0

void Kit_SopBestLiteralCover
               (Kit_Sop_t *cResult,Kit_Sop_t *cSop,uint uCube,int nLits,Vec_Int_t *vMemory)

{
  int i;
  uint uCube_00;
  uint *puVar1;
  int iLitBest;
  Vec_Int_t *vMemory_local;
  int nLits_local;
  uint uCube_local;
  Kit_Sop_t *cSop_local;
  Kit_Sop_t *cResult_local;
  
  i = Kit_SopBestLiteral(cSop,nLits,uCube);
  cResult->nCubes = 0;
  puVar1 = Vec_IntFetch(vMemory,1);
  cResult->pCubes = puVar1;
  uCube_00 = Kit_CubeSetLit(0,i);
  Kit_SopPushCube(cResult,uCube_00);
  return;
}

Assistant:

void Kit_SopBestLiteralCover( Kit_Sop_t * cResult, Kit_Sop_t * cSop, unsigned uCube, int nLits, Vec_Int_t * vMemory )
{
    int iLitBest;
    // get the best literal
    iLitBest = Kit_SopBestLiteral( cSop, nLits, uCube );
    // start the cover
    cResult->nCubes = 0;
    cResult->pCubes = Vec_IntFetch( vMemory, 1 );
    // set the cube
    Kit_SopPushCube( cResult, Kit_CubeSetLit(0, iLitBest) );
}